

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon.cpp
# Opt level: O2

int keysymToQtKey_internal
              (xkb_keysym_t keysym,KeyboardModifiers modifiers,xkb_state *state,xkb_keycode_t code,
              bool superAsMeta,bool hyperAsMeta)

{
  qsizetype qVar1;
  bool bVar2;
  char32_t cVar3;
  int iVar4;
  xkb2qt *pxVar5;
  Data *pDVar6;
  char32_t cVar7;
  char16_t *pcVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (keysym - 0xffbe < 0x23) {
    cVar7 = keysym + L'\x00ff0072';
  }
  else if (keysym - 0xffb0 < 10) {
    cVar7 = keysym + L'\xffff0080';
  }
  else if (keysym - 0x20 < 0xe0) {
    cVar3 = QXkbCommon::qxkbcommon_xkb_keysym_to_upper(keysym);
    cVar7 = keysym;
    if ((uint)(cVar3 + L'\xffffffe0') < 0xe0) {
      cVar7 = cVar3;
    }
  }
  else {
    local_58.d = (Data *)(ulong)keysym;
    pxVar5 = std::__lower_bound<xkb2qt_const*,xkb2qt,__gnu_cxx::__ops::_Iter_less_val>
                       (&KeyTbl,&DAT_0061d038);
    cVar7 = L'\0';
    if ((pxVar5 != (xkb2qt *)&DAT_0061d038) && (cVar7 = L'\0', pxVar5->xkb <= (uint)local_58.d)) {
      cVar7 = pxVar5->qt;
    }
    cVar3 = cVar7;
    if ((uint)(cVar7 + L'\xfeffffad') < 2) {
      cVar3 = L'\x01000022';
    }
    if (!superAsMeta) {
      cVar3 = cVar7;
    }
    cVar7 = L'\x01000022';
    if ((cVar3 & 0xfffffffeU) != 0x1000056) {
      cVar7 = cVar3;
    }
    if (!hyperAsMeta) {
      cVar7 = cVar3;
    }
    if (cVar7 == L'\0') {
      local_58.d = (Data *)0x0;
      local_58.ptr = (char16_t *)0x0;
      local_58.size = 0;
      if (state == (xkb_state *)0x0 ||
          ((uint)modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                 super_QFlagsStorage<Qt::KeyboardModifier>.i >> 0x1a & 1) != 0) {
        QXkbCommon::lookupStringNoKeysymTransformations((QString *)&local_78,keysym);
        local_58.d = local_78.d;
        pDVar6 = (Data *)local_78.ptr;
        pcVar8 = (char16_t *)local_78.size;
      }
      else {
        QXkbCommon::lookupString((QString *)&local_78,state,code);
        local_58.d = local_78.d;
        pDVar6 = (Data *)local_78.ptr;
        pcVar8 = (char16_t *)local_78.size;
      }
      local_78.size = 0;
      local_78.ptr = (char16_t *)0x0;
      local_78.d = (Data *)0x0;
      local_58.ptr = (char16_t *)pDVar6;
      local_58.size = (qsizetype)pcVar8;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      if (pcVar8 == (char16_t *)0x0) {
        cVar7 = L'\0';
      }
      else {
        if (pDVar6 == (Data *)0x0) {
          pDVar6 = (Data *)&QString::_empty;
        }
        bVar2 = QChar::isDigit((QChar *)pDVar6);
        if (bVar2) {
          pDVar6 = (Data *)local_58.ptr;
          if ((Data *)local_58.ptr == (Data *)0x0) {
            pDVar6 = (Data *)&QString::_empty;
          }
          iVar4 = QChar::digitValue((QChar *)pDVar6);
          cVar7 = iVar4 + L'0';
        }
        else {
          QString::toUpper_helper((QString *)&local_78);
          qVar1 = local_58.size;
          pcVar8 = local_58.ptr;
          pDVar6 = local_58.d;
          local_58.d = local_78.d;
          local_58.ptr = local_78.ptr;
          local_78.d = pDVar6;
          local_78.ptr = pcVar8;
          local_58.size = local_78.size;
          local_78.size = qVar1;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
          local_78.d = (Data *)local_58.ptr;
          local_78.ptr = local_58.ptr;
          local_78.size =
               (long)&(((QArrayData *)local_58.ptr)->ref_)._q_value.super___atomic_base<int>._M_i +
               local_58.size * 2;
          cVar7 = QStringIterator::next((QStringIterator *)&local_78,L'\0');
        }
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return cVar7;
}

Assistant:

static int keysymToQtKey_internal(xkb_keysym_t keysym, Qt::KeyboardModifiers modifiers,
                                  xkb_state *state, xkb_keycode_t code,
                                  bool superAsMeta, bool hyperAsMeta)
{
    int qtKey = 0;

    // lookup from direct mapping
    if (keysym >= XKB_KEY_F1 && keysym <= XKB_KEY_F35) {
        // function keys
        qtKey = Qt::Key_F1 + (keysym - XKB_KEY_F1);
    } else if (keysym >= XKB_KEY_KP_0 && keysym <= XKB_KEY_KP_9) {
        // numeric keypad keys
        qtKey = Qt::Key_0 + (keysym - XKB_KEY_KP_0);
    } else if (QXkbCommon::isLatin1(keysym)) {
        // Most Qt::Key values are determined by their upper-case version,
        // where this is in the Latin-1 repertoire. So start with that:
        qtKey = QXkbCommon::qxkbcommon_xkb_keysym_to_upper(keysym);
        // However, Key_mu and Key_ydiaeresis are U+00B5 MICRO SIGN and
        // U+00FF LATIN SMALL LETTER Y WITH DIAERESIS, both lower-case,
        // with upper-case forms outside Latin-1, so use them as they are
        // since they're the Qt::Key values.
        if (!QXkbCommon::isLatin1(qtKey))
            qtKey = keysym;
    } else {
        // check if we have a direct mapping
        xkb2qt_t searchKey{keysym, 0};
        auto it = std::lower_bound(KeyTbl.cbegin(), KeyTbl.cend(), searchKey);
        if (it != KeyTbl.end() && !(searchKey < *it))
            qtKey = it->qt;

        // translate Super/Hyper keys to Meta if we're using them as the MetaModifier
        if (superAsMeta && (qtKey == Qt::Key_Super_L || qtKey == Qt::Key_Super_R))
            qtKey = Qt::Key_Meta;
        if (hyperAsMeta && (qtKey == Qt::Key_Hyper_L || qtKey == Qt::Key_Hyper_R))
            qtKey = Qt::Key_Meta;
    }

    if (qtKey)
        return qtKey;

    // lookup from unicode
    QString text;
    if (!state || modifiers & Qt::ControlModifier) {
        // Control modifier changes the text to ASCII control character, therefore we
        // can't use this text to map keysym to a qt key. We can use the same keysym
        // (it is not affectd by transformation) to obtain untransformed text. For details
        // see "Appendix A. Default Symbol Transformations" in the XKB specification.
        text = QXkbCommon::lookupStringNoKeysymTransformations(keysym);
    } else {
        text = QXkbCommon::lookupString(state, code);
    }
    if (!text.isEmpty()) {
         if (text.unicode()->isDigit()) {
             // Ensures that also non-latin digits are mapped to corresponding qt keys,
             // e.g CTRL + ۲ (arabic two), is mapped to CTRL + Qt::Key_2.
             qtKey = Qt::Key_0 + text.unicode()->digitValue();
         } else {
             text = text.toUpper();
             QStringIterator i(text);
             qtKey = i.next(0);
         }
    }

    return qtKey;
}